

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node_struct *root,char_t *indent,uint flags,
               uint depth)

{
  bool bVar1;
  uint uVar2;
  char_t *in_RCX;
  xml_buffered_writer *in_RDX;
  xml_buffered_writer *extraout_RDX;
  xml_buffered_writer *extraout_RDX_00;
  xml_buffered_writer *extraout_RDX_01;
  xml_buffered_writer *extraout_RDX_02;
  xml_buffered_writer *extraout_RDX_03;
  xml_buffered_writer *extraout_RDX_04;
  xml_buffered_writer *extraout_RDX_05;
  xml_node_struct *in_RSI;
  xml_buffered_writer *in_RDI;
  uint in_R8D;
  xml_node_struct *node;
  xml_node_struct *in_stack_00000018;
  uint indent_flags;
  size_t indent_length;
  char_t *local_40;
  xml_node_struct *node_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  char_t *pcVar4;
  xml_buffered_writer *pxVar5;
  
  uVar2 = (uint)in_RCX;
  pxVar5 = in_RDX;
  if ((((ulong)in_RCX & 0x41) == 0) || (((ulong)in_RCX & 4) != 0)) {
    local_40 = (char_t *)0x0;
  }
  else {
    local_40 = (char_t *)strlength((char_t *)0x12494e);
    in_RDX = extraout_RDX;
  }
  uVar3 = 2;
  node_00 = in_RSI;
  do {
    if ((((uint)node_00->header & 0xf) == 3) || (((uint)node_00->header & 0xf) == 4)) {
      node_output_simple((xml_buffered_writer *)indent_length,in_stack_00000018,node._4_4_);
      uVar3 = 0;
      in_RDX = extraout_RDX_00;
      pcVar4 = local_40;
LAB_00124ae0:
      while (node_00 != in_RSI) {
        if (node_00->next_sibling != (xml_node_struct *)0x0) {
          node_00 = node_00->next_sibling;
          break;
        }
        node_00 = node_00->parent;
        if (((uint)node_00->header & 0xf) == 2) {
          in_R8D = in_R8D - 1;
          if (((uVar3 & 1) != 0) && ((uVar2 & 4) == 0)) {
            xml_buffered_writer::write(in_RDI,10,in_RDX,(size_t)in_RCX);
          }
          if (((uVar3 & 2) != 0) && (pcVar4 != (char_t *)0x0)) {
            in_RCX = (char_t *)(ulong)in_R8D;
            text_output_indent((xml_buffered_writer *)CONCAT44(uVar2,in_R8D),pcVar4,
                               CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                               (uint)((ulong)node_00 >> 0x20));
          }
          node_output_end((xml_buffered_writer *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),node_00);
          uVar3 = 3;
          in_RDX = extraout_RDX_05;
        }
      }
    }
    else {
      if (((uVar3 & 1) != 0) && ((uVar2 & 4) == 0)) {
        xml_buffered_writer::write(in_RDI,10,in_RDX,(size_t)in_RCX);
        in_RDX = extraout_RDX_01;
      }
      if (((uVar3 & 2) != 0) && (local_40 != (char_t *)0x0)) {
        in_RCX = (char_t *)(ulong)in_R8D;
        text_output_indent((xml_buffered_writer *)CONCAT44(uVar2,in_R8D),local_40,
                           CONCAT44(uVar3,in_stack_ffffffffffffffd0),(uint)((ulong)node_00 >> 0x20))
        ;
        in_RDX = extraout_RDX_02;
      }
      pcVar4 = local_40;
      if (((uint)node_00->header & 0xf) != 2) {
        if (((uint)node_00->header & 0xf) == 1) {
          uVar3 = 2;
          if (node_00->first_child != (xml_node_struct *)0x0) {
            node_00 = node_00->first_child;
            goto LAB_00124baa;
          }
        }
        else {
          node_output_simple((xml_buffered_writer *)indent_length,in_stack_00000018,node._4_4_);
          uVar3 = 3;
          in_RDX = extraout_RDX_04;
          pcVar4 = local_40;
        }
        goto LAB_00124ae0;
      }
      uVar3 = 3;
      bVar1 = node_output_start(pxVar5,(xml_node_struct *)CONCAT44(uVar2,in_R8D),local_40,
                                CONCAT44(3,in_stack_ffffffffffffffd0),(uint)((ulong)node_00 >> 0x20)
                                ,(uint)node_00);
      in_RCX = local_40;
      in_RDX = extraout_RDX_03;
      if (!bVar1) goto LAB_00124ae0;
      if (node_00->value != (char_t *)0x0) {
        uVar3 = 0;
      }
      node_00 = node_00->first_child;
      in_R8D = in_R8D + 1;
    }
LAB_00124baa:
    local_40 = pcVar4;
    if (node_00 == in_RSI) {
      if (((uVar3 & 1) != 0) && ((uVar2 & 4) == 0)) {
        xml_buffered_writer::write(in_RDI,10,in_RDX,(size_t)in_RCX);
      }
      return;
    }
  } while( true );
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, xml_node_struct* root, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		size_t indent_length = ((flags & (format_indent | format_indent_attributes)) && (flags & format_raw) == 0) ? strlength(indent) : 0;
		unsigned int indent_flags = indent_indent;

		xml_node_struct* node = root;

		do
		{
			assert(node);

			// begin writing current node
			if (PUGI__NODETYPE(node) == node_pcdata || PUGI__NODETYPE(node) == node_cdata)
			{
				node_output_simple(writer, node, flags);

				indent_flags = 0;
			}
			else
			{
				if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
					writer.write('\n');

				if ((indent_flags & indent_indent) && indent_length)
					text_output_indent(writer, indent, indent_length, depth);

				if (PUGI__NODETYPE(node) == node_element)
				{
					indent_flags = indent_newline | indent_indent;

					if (node_output_start(writer, node, indent, indent_length, flags, depth))
					{
						// element nodes can have value if parse_embed_pcdata was used
						if (node->value)
							indent_flags = 0;

						node = node->first_child;
						depth++;
						continue;
					}
				}
				else if (PUGI__NODETYPE(node) == node_document)
				{
					indent_flags = indent_indent;

					if (node->first_child)
					{
						node = node->first_child;
						continue;
					}
				}
				else
				{
					node_output_simple(writer, node, flags);

					indent_flags = indent_newline | indent_indent;
				}
			}

			// continue to the next node
			while (node != root)
			{
				if (node->next_sibling)
				{
					node = node->next_sibling;
					break;
				}

				node = node->parent;

				// write closing node
				if (PUGI__NODETYPE(node) == node_element)
				{
					depth--;

					if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
						writer.write('\n');

					if ((indent_flags & indent_indent) && indent_length)
						text_output_indent(writer, indent, indent_length, depth);

					node_output_end(writer, node);

					indent_flags = indent_newline | indent_indent;
				}
			}
		}
		while (node != root);

		if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
			writer.write('\n');
	}